

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

Vec_Int_t *
Saig_StrSimPerformMatching(Aig_Man_t *p0,Aig_Man_t *p1,int nDist,int fVerbose,Aig_Man_t **ppMiter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  abctime aVar6;
  abctime aVar7;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar8;
  Aig_Man_t *pAVar9;
  int nNodes;
  int nFlops;
  abctime clkTotal;
  abctime clk;
  int nMatches;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Man_t *pPart1;
  Aig_Man_t *pPart0;
  Vec_Int_t *vPairs;
  Aig_Man_t **ppMiter_local;
  int fVerbose_local;
  int nDist_local;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  vPairs = (Vec_Int_t *)ppMiter;
  ppMiter_local._0_4_ = fVerbose;
  ppMiter_local._4_4_ = nDist;
  _fVerbose_local = p1;
  p1_local = p0;
  aVar5 = Abc_Clock();
  Aig_ManRandom(1);
  if (_fVerbose_local == (Aig_Man_t *)0x0) {
    if ((int)ppMiter_local != 0) {
      Aig_ManPrintStats(p1_local);
    }
    iVar1 = Saig_ManDemiterSimpleDiff(p1_local,&pPart1,(Aig_Man_t **)&pObj0);
    if (iVar1 == 0) {
      Abc_Print(1,"Demitering has failed.\n");
      return (Vec_Int_t *)0x0;
    }
  }
  else {
    pPart1 = Aig_ManDupSimple(p1_local);
    pObj0 = (Aig_Obj_t *)Aig_ManDupSimple(_fVerbose_local);
  }
  if ((int)ppMiter_local != 0) {
    Aig_ManPrintStats(pPart1);
    Aig_ManPrintStats((Aig_Man_t *)pObj0);
  }
  Saig_StrSimPrepareAig(pPart1);
  Saig_StrSimPrepareAig((Aig_Man_t *)pObj0);
  Saig_StrSimSetInitMatching(pPart1,(Aig_Man_t *)pObj0);
  if ((int)ppMiter_local != 0) {
    iVar1 = Aig_ManObjNumMax(pPart1);
    Abc_Print(1,"Allocated %6.2f MB to simulate the first AIG.\n",
              ((double)iVar1 * 1.0 * 16.0 * 4.0) / 1048576.0);
    iVar1 = Aig_ManObjNumMax((Aig_Man_t *)pObj0);
    Abc_Print(1,"Allocated %6.2f MB to simulate the second AIG.\n",
              ((double)iVar1 * 1.0 * 16.0 * 4.0) / 1048576.0);
  }
  clk._0_4_ = 1;
  clk._4_4_ = 0;
  while (0 < (int)(uint)clk) {
    aVar6 = Abc_Clock();
    Saig_StrSimulateRound(pPart1,(Aig_Man_t *)pObj0);
    clk._0_4_ = Saig_StrSimDetectUnique(pPart1,(Aig_Man_t *)pObj0);
    if ((int)ppMiter_local != 0) {
      uVar2 = Saig_StrSimCountMatchedFlops(pPart1);
      uVar3 = Saig_StrSimCountMatchedNodes(pPart1);
      iVar1 = Aig_ManRegNum(pPart1);
      iVar4 = Aig_ManNodeNum(pPart1);
      Abc_Print(1,"%3d : Match =%6d.  FF =%6d. (%6.2f %%)  Node =%6d. (%6.2f %%)  ",
                ((double)(int)uVar2 * 100.0) / (double)iVar1,
                ((double)(int)uVar3 * 100.0) / (double)iVar4,(ulong)clk._4_4_,(ulong)(uint)clk,
                (ulong)uVar2,(ulong)uVar3);
      Abc_Print(1,"%s =","Time");
      aVar7 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar6) * 1.0) / 1000000.0);
    }
    if (clk._4_4_ == 0x14) break;
    clk._4_4_ = clk._4_4_ + 1;
  }
  Vec_PtrFree((Vec_Ptr_t *)pPart1->pData2);
  pPart1->pData2 = (void *)0x0;
  Vec_PtrFree((Vec_Ptr_t *)pObj0[6].pFanin1);
  pObj0[6].pFanin1 = (Aig_Obj_t *)0x0;
  Aig_ManFanoutStart(pPart1);
  Aig_ManFanoutStart((Aig_Man_t *)pObj0);
  if (ppMiter_local._4_4_ != 0) {
    Ssw_StrSimMatchingExtend(pPart1,(Aig_Man_t *)pObj0,ppMiter_local._4_4_,(int)ppMiter_local);
  }
  Saig_StrSimSetFinalMatching(pPart1,(Aig_Man_t *)pObj0);
  iVar1 = Aig_ManObjNumMax(pPart1);
  pPart0 = (Aig_Man_t *)Vec_IntAlloc(iVar1 << 1);
  clk._4_4_ = 0;
  do {
    iVar1 = Vec_PtrSize(pPart1->vObjs);
    if (iVar1 <= (int)clk._4_4_) {
      if (vPairs != (Vec_Int_t *)0x0) {
        pAVar9 = Saig_ManWindowExtractMiter(pPart1,(Aig_Man_t *)pObj0);
        *(Aig_Man_t **)vPairs = pAVar9;
      }
      Aig_ManFanoutStop(pPart1);
      Aig_ManFanoutStop((Aig_Man_t *)pObj0);
      Aig_ManStop(pPart1);
      Aig_ManStop((Aig_Man_t *)pObj0);
      Abc_Print(1,"%s =","Total runtime");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
      return (Vec_Int_t *)pPart0;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pPart1->vObjs,clk._4_4_);
    if ((pObj != (Aig_Obj_t *)0x0) &&
       (pObj_00 = Aig_ObjRepr(pPart1,pObj), pObj_00 != (Aig_Obj_t *)0x0)) {
      pAVar8 = Aig_ObjRepr((Aig_Man_t *)pObj0,pObj_00);
      if (pObj != pAVar8) {
        __assert_fail("pObj0 == Aig_ObjRepr(pPart1, pObj1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigStrSim.c"
                      ,0x3bb,
                      "Vec_Int_t *Saig_StrSimPerformMatching(Aig_Man_t *, Aig_Man_t *, int, int, Aig_Man_t **)"
                     );
      }
      Vec_IntPush((Vec_Int_t *)pPart0,pObj->Id);
      Vec_IntPush((Vec_Int_t *)pPart0,pObj_00->Id);
    }
    clk._4_4_ = clk._4_4_ + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Saig_StrSimPerformMatching( Aig_Man_t * p0, Aig_Man_t * p1, int nDist, int fVerbose, Aig_Man_t ** ppMiter )
{
    extern Aig_Man_t * Saig_ManWindowExtractMiter( Aig_Man_t * p0, Aig_Man_t * p1 );

    Vec_Int_t * vPairs;
    Aig_Man_t * pPart0, * pPart1;
    Aig_Obj_t * pObj0, * pObj1;
    int i, nMatches;
    abctime clk, clkTotal = Abc_Clock();
    Aig_ManRandom( 1 );
    // consider the case when a miter is given
    if ( p1 == NULL )
    {
        if ( fVerbose )
        {
            Aig_ManPrintStats( p0 );
        }
        // demiter the miter
        if ( !Saig_ManDemiterSimpleDiff( p0, &pPart0, &pPart1 ) )
        {
            Abc_Print( 1, "Demitering has failed.\n" );
            return NULL;
        }
    }
    else
    {
        pPart0 = Aig_ManDupSimple( p0 );
        pPart1 = Aig_ManDupSimple( p1 );
    }
    if ( fVerbose )
    {
        Aig_ManPrintStats( pPart0 );
        Aig_ManPrintStats( pPart1 );
    }
    // start simulation 
    Saig_StrSimPrepareAig( pPart0 );
    Saig_StrSimPrepareAig( pPart1 );
    Saig_StrSimSetInitMatching( pPart0, pPart1 );
    if ( fVerbose )
    {
        Abc_Print( 1, "Allocated %6.2f MB to simulate the first AIG.\n",
            1.0 * Aig_ManObjNumMax(pPart0) * SAIG_WORDS * sizeof(unsigned) / (1<<20) );
        Abc_Print( 1, "Allocated %6.2f MB to simulate the second AIG.\n",
            1.0 * Aig_ManObjNumMax(pPart1) * SAIG_WORDS * sizeof(unsigned) / (1<<20) );
    }
    // iterate matching
    nMatches = 1;
    for ( i = 0; nMatches > 0; i++ )
    {
        clk = Abc_Clock();
        Saig_StrSimulateRound( pPart0, pPart1 );
        nMatches = Saig_StrSimDetectUnique( pPart0, pPart1 );
        if ( fVerbose )
        {
            int nFlops = Saig_StrSimCountMatchedFlops(pPart0);
            int nNodes = Saig_StrSimCountMatchedNodes(pPart0);
            Abc_Print( 1, "%3d : Match =%6d.  FF =%6d. (%6.2f %%)  Node =%6d. (%6.2f %%)  ",
                i, nMatches,
                nFlops, 100.0*nFlops/Aig_ManRegNum(pPart0),
                nNodes, 100.0*nNodes/Aig_ManNodeNum(pPart0) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( i == 20 )
            break;
    }
    // cleanup
    Vec_PtrFree( (Vec_Ptr_t *)pPart0->pData2 ); pPart0->pData2 = NULL;
    Vec_PtrFree( (Vec_Ptr_t *)pPart1->pData2 ); pPart1->pData2 = NULL;
    // extend the islands
    Aig_ManFanoutStart( pPart0 );
    Aig_ManFanoutStart( pPart1 );
    if ( nDist )
        Ssw_StrSimMatchingExtend( pPart0, pPart1, nDist, fVerbose );
    Saig_StrSimSetFinalMatching( pPart0, pPart1 );
//    Saig_StrSimSetContiguousMatching( pPart0, pPart1 );
    // copy the results into array
    vPairs = Vec_IntAlloc( 2*Aig_ManObjNumMax(pPart0) );
    Aig_ManForEachObj( pPart0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr(pPart0, pObj0);
        if ( pObj1 == NULL )
            continue;
        assert( pObj0 == Aig_ObjRepr(pPart1, pObj1) );
        Vec_IntPush( vPairs, pObj0->Id );
        Vec_IntPush( vPairs, pObj1->Id );
    }
    // this procedure adds matching of PO and LI
    if ( ppMiter )
        *ppMiter = Saig_ManWindowExtractMiter( pPart0, pPart1 );
    Aig_ManFanoutStop( pPart0 );
    Aig_ManFanoutStop( pPart1 );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    return vPairs;
}